

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::heuristic_propagation_of_context_sets
               (int tau_addr,Contexts *contexts,vector<bool,_std::allocator<bool>_> *complete,
               StateConfigs *scs,StatesInProgress *states,ParserGraph *states2scs,Configs *cs,
               GrammarPtr *grammar)

{
  int iVar1;
  int iVar2;
  const_reference this;
  reference pvVar3;
  element_type *peVar4;
  reference pvVar5;
  reference this_00;
  reference local_90;
  int local_7c;
  const_reference pvStack_78;
  int tau_prime_addr;
  value_type *prod2;
  value_type *config2;
  value_type config_j;
  int cis_j;
  value_type *prod;
  value_type *config;
  type pSStack_48;
  value_type config_i;
  StateInProgress *state;
  value_type *tau;
  ParserGraph *states2scs_local;
  StatesInProgress *states_local;
  StateConfigs *scs_local;
  vector<bool,_std::allocator<bool>_> *complete_local;
  Contexts *contexts_local;
  int tau_addr_local;
  
  tau = (value_type *)states2scs;
  states2scs_local = (ParserGraph *)states;
  states_local = (StatesInProgress *)scs;
  scs_local = (StateConfigs *)complete;
  complete_local = (vector<bool,_std::allocator<bool>_> *)contexts;
  contexts_local._4_4_ = tau_addr;
  state = (StateInProgress *)at<Omega_h::StateConfig>(scs,tau_addr);
  this = at<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                   ((vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                     *)states2scs_local,
                    *(int *)&(state->configs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
  pSStack_48 = std::
               unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
               ::operator*(this);
  pvVar3 = at<int>(&pSStack_48->configs,
                   *(int *)((long)&(state->configs).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 4));
  config._4_4_ = *pvVar3;
  prod = (value_type *)at<Omega_h::Config>(cs,config._4_4_);
  if (*(int *)&prod->field_0x4 == 0) {
    peVar4 = std::
             __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)grammar);
    _config_j = at<Omega_h::Grammar::Production>(&peVar4->productions,prod->lhs);
    for (config2._4_4_ = 0; iVar1 = config2._4_4_, iVar2 = size<int>(&pSStack_48->configs),
        iVar1 < iVar2; config2._4_4_ = config2._4_4_ + 1) {
      pvVar3 = at<int>(&pSStack_48->configs,config2._4_4_);
      config2._0_4_ = *pvVar3;
      if (((int)config2 != config._4_4_) &&
         (prod2 = (value_type *)at<Omega_h::Config>(cs,(int)config2), *(int *)&prod2->field_0x4 == 0
         )) {
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)grammar);
        pvStack_78 = at<Omega_h::Grammar::Production>(&peVar4->productions,prod2->lhs);
        if (_config_j->lhs == pvStack_78->lhs) {
          local_7c = at((ParserGraph *)tau,
                        *(int *)&(state->configs).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start,config2._4_4_);
          pvVar5 = at<std::set<int,std::less<int>,std::allocator<int>>>
                             ((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               *)complete_local,contexts_local._4_4_);
          this_00 = at<std::set<int,std::less<int>,std::allocator<int>>>
                              ((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                *)complete_local,local_7c);
          std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(this_00,pvVar5);
          local_90 = at<bool>((vector<bool,_std::allocator<bool>_> *)scs_local,local_7c);
          std::_Bit_reference::operator=(&local_90,true);
        }
      }
    }
  }
  return;
}

Assistant:

static void heuristic_propagation_of_context_sets(int tau_addr,
    Contexts& contexts, std::vector<bool>& complete, StateConfigs const& scs,
    StatesInProgress const& states, ParserGraph const& states2scs,
    Configs const& cs, GrammarPtr grammar) {
  auto& tau = at(scs, tau_addr);
  auto& state = *at(states, tau.state);
  auto config_i = at(state.configs, tau.config_in_state);
  auto& config = at(cs, config_i);
  if (config.dot != 0) return;
  auto& prod = at(grammar->productions, config.production);
  for (int cis_j = 0; cis_j < size(state.configs); ++cis_j) {
    auto config_j = at(state.configs, cis_j);
    if (config_j == config_i) continue;
    auto& config2 = at(cs, config_j);
    if (config2.dot != 0) continue;
    auto& prod2 = at(grammar->productions, config2.production);
    if (prod.lhs != prod2.lhs) continue;
    auto tau_prime_addr = at(states2scs, tau.state, cis_j);
    at(contexts, tau_prime_addr) = at(contexts, tau_addr);
    at(complete, tau_prime_addr) = true;
  }
}